

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_16f66::reduceY<Imath_3_2::half>
               (TypedImageChannel<Imath_3_2::half> *channel0,
               TypedImageChannel<Imath_3_2::half> *channel1,bool filter,Extrapolation ext,bool odd)

{
  half hVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Image *pIVar5;
  half *phVar6;
  byte in_DL;
  ImageChannel *in_RSI;
  ImageChannel *in_RDI;
  double dVar7;
  int x_1;
  int y_1;
  int offset;
  int x;
  int y;
  double f;
  int h1;
  int h0;
  int w1;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  TypedImageChannel<Imath_3_2::half> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar8;
  
  pIVar5 = ImageChannel::image(in_RSI);
  iVar2 = Image::width(pIVar5);
  pIVar5 = ImageChannel::image(in_RDI);
  iVar3 = Image::height(pIVar5);
  pIVar5 = ImageChannel::image(in_RSI);
  iVar4 = Image::height(pIVar5);
  if ((in_DL & 1) == 0) {
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
        in_stack_ffffffffffffffa0 =
             (TypedImageChannel<Imath_3_2::half> *)
             TypedImageChannel<Imath_3_2::half>::operator()
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
        phVar6 = TypedImageChannel<Imath_3_2::half>::operator()
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                            in_stack_ffffffffffffff98);
        phVar6->_h = *(uint16_t *)
                      &(in_stack_ffffffffffffffa0->super_ImageChannel)._vptr_ImageChannel;
      }
    }
  }
  else {
    if (iVar4 < 2) {
      dVar7 = 1.0;
    }
    else {
      dVar7 = (double)(iVar3 + -2) / (double)(iVar4 + -1);
    }
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
        hVar1 = filterY<Imath_3_2::half>
                          ((TypedImageChannel<Imath_3_2::half> *)CONCAT44(iVar3,iVar8),
                           in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                           (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (Extrapolation)((ulong)dVar7 >> 0x20));
        in_stack_ffffffffffffffc4 = CONCAT22(hVar1._h,(short)in_stack_ffffffffffffffc4);
        phVar6 = TypedImageChannel<Imath_3_2::half>::operator()
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                            in_stack_ffffffffffffff98);
        phVar6->_h = (uint16_t)((uint)in_stack_ffffffffffffffc4 >> 0x10);
      }
    }
  }
  return;
}

Assistant:

void
reduceY (
    const TypedImageChannel<T>& channel0,
    TypedImageChannel<T>&       channel1,
    bool                        filter,
    Extrapolation               ext,
    bool                        odd)
{
    //
    // Shrink an image channel, channel0, vertically
    // by a factor of 2, and store the result in channel1.
    //

    int w1 = channel1.image ().width ();
    int h0 = channel0.image ().height ();
    int h1 = channel1.image ().height ();

    if (filter)
    {
        //
        // Low-pass filter and resample.
        // For pixels (x, 0) and (x, h1 - 1) in channel 1,
        // the low-pass filter in channel0 is centered on
        // pixels (x, 0.5) and (x, h0 - 1.5) respectively.
        //

        double f = (h1 > 1) ? double (h0 - 2) / (h1 - 1) : 1;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = filterY (channel0, h0, x, y * f, ext);
    }
    else
    {
        //
        // Resample, skipping every other pixel, without
        // low-pass filtering.  In order to keep the image
        // from sliding towards the top if the channel is
        // resampled repeatedly, we skip the top pixel of
        // every column on even passes, and the bottom pixel
        // on odd passes.
        //

        int offset = odd ? ((h0 - 1) - 2 * (h1 - 1)) : 0;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = channel0 (x, 2 * y + offset);
    }
}